

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * listbanned(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff5c8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff5d0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff600;
  allocator<char> *in_stack_fffffffffffff608;
  iterator in_stack_fffffffffffff610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff618;
  undefined8 in_stack_fffffffffffff628;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff630;
  undefined1 *puVar2;
  string *in_stack_fffffffffffff638;
  RPCResult *in_stack_fffffffffffff640;
  RPCResults *in_stack_fffffffffffff648;
  RPCResult *in_stack_fffffffffffff650;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  allocator<char> local_82e;
  allocator<char> local_82d;
  allocator<char> local_82c;
  allocator<char> local_82b [3];
  pointer local_828;
  pointer pRStack_820;
  pointer local_818;
  allocator<char> local_80a;
  allocator<char> local_809;
  _Alloc_hider local_808;
  size_type sStack_800;
  undefined1 local_7f8 [15];
  allocator<char> local_7e9;
  _Alloc_hider local_7e8;
  size_type sStack_7e0;
  undefined8 local_7d8;
  undefined8 in_stack_fffffffffffff830;
  allocator<char> local_7a9;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  allocator<char> local_782;
  undefined1 local_781 [31];
  undefined1 local_762;
  vector<RPCArg,_std::allocator<RPCArg>_> local_761;
  undefined1 local_742;
  undefined1 local_741 [33];
  undefined8 uStack_720;
  undefined8 local_718;
  undefined1 local_702 [642];
  undefined1 local_480 [680];
  undefined1 local_1d8 [64];
  undefined1 local_198 [136];
  undefined1 local_110 [264];
  long local_8;
  
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff628 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  this_00 = (RPCHelpMan *)local_702;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  local_741._25_8_ = 0;
  uStack_720 = 0;
  local_718 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff5c8);
  name = (string *)local_741;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  description = (string *)&local_742;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  args = &local_761;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  results = (RPCResults *)&local_762;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  examples = (RPCExamples *)local_781;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  local_7a8 = 0;
  uStack_7a0 = 0;
  local_798 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff650,(Type)((ulong)in_stack_fffffffffffff648 >> 0x20),
             (string *)in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::operator+((char *)in_stack_fffffffffffff618,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff610);
  std::operator+(in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff650,(Type)((ulong)in_stack_fffffffffffff648 >> 0x20),
             (string *)in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::operator+((char *)in_stack_fffffffffffff618,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff610);
  std::operator+(in_stack_fffffffffffff5e0,(char *)in_stack_fffffffffffff5d8);
  local_7e8._M_p = (pointer)0x0;
  sStack_7e0 = 0;
  local_7d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff650,(Type)((ulong)in_stack_fffffffffffff648 >> 0x20),
             (string *)in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  local_808._M_p = (pointer)0x0;
  sStack_800 = 0;
  local_7f8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff650,(Type)((ulong)in_stack_fffffffffffff648 >> 0x20),
             (string *)in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630
             ,(bool)skip_type_check);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  local_828 = (pointer)0x0;
  pRStack_820 = (pointer)0x0;
  local_818 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5c8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff650,(Type)((ulong)in_stack_fffffffffffff648 >> 0x20),
             (string *)in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630
             ,(bool)skip_type_check);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff5c8);
  __l._M_len = (size_type)in_stack_fffffffffffff618;
  __l._M_array = in_stack_fffffffffffff610;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff608,__l,
             (allocator_type *)in_stack_fffffffffffff600);
  RPCResult::RPCResult
            (in_stack_fffffffffffff650,(Type)((ulong)in_stack_fffffffffffff648 >> 0x20),
             (string *)in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630
             ,(bool)skip_type_check);
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff5c8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff618;
  __l_00._M_array = in_stack_fffffffffffff610;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff608,__l_00,
             (allocator_type *)in_stack_fffffffffffff600);
  RPCResult::RPCResult
            (in_stack_fffffffffffff650,(Type)((ulong)in_stack_fffffffffffff648 >> 0x20),
             (string *)in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff648,in_stack_fffffffffffff640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  HelpExampleCli(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608);
  HelpExampleRpc(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
  std::operator+(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff5c8,(string *)0x64d8a3);
  this = (RPCResult *)&stack0xfffffffffffff7b0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<listbanned()::__0,void>
            (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff830);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_82e);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_82d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_82c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_82b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_198;
  puVar1 = local_110;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(this);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_480;
  puVar1 = local_1d8;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult(this);
  } while (puVar1 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_80a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_809);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_7f8 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_7e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff837);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_7a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_782);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_781);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_762);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_742);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_741);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff5d8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_702);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_702 + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan listbanned()
{
    return RPCHelpMan{"listbanned",
                "\nList all manually banned IPs/Subnets.\n",
                {},
        RPCResult{RPCResult::Type::ARR, "", "",
            {
                {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "address", "The IP/Subnet of the banned node"},
                        {RPCResult::Type::NUM_TIME, "ban_created", "The " + UNIX_EPOCH_TIME + " the ban was created"},
                        {RPCResult::Type::NUM_TIME, "banned_until", "The " + UNIX_EPOCH_TIME + " the ban expires"},
                        {RPCResult::Type::NUM_TIME, "ban_duration", "The ban duration, in seconds"},
                        {RPCResult::Type::NUM_TIME, "time_remaining", "The time remaining until the ban expires, in seconds"},
                    }},
            }},
                RPCExamples{
                    HelpExampleCli("listbanned", "")
                            + HelpExampleRpc("listbanned", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    BanMan& banman = EnsureAnyBanman(request.context);

    banmap_t banMap;
    banman.GetBanned(banMap);
    const int64_t current_time{GetTime()};

    UniValue bannedAddresses(UniValue::VARR);
    for (const auto& entry : banMap)
    {
        const CBanEntry& banEntry = entry.second;
        UniValue rec(UniValue::VOBJ);
        rec.pushKV("address", entry.first.ToString());
        rec.pushKV("ban_created", banEntry.nCreateTime);
        rec.pushKV("banned_until", banEntry.nBanUntil);
        rec.pushKV("ban_duration", (banEntry.nBanUntil - banEntry.nCreateTime));
        rec.pushKV("time_remaining", (banEntry.nBanUntil - current_time));

        bannedAddresses.push_back(std::move(rec));
    }

    return bannedAddresses;
},
    };
}